

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O1

void * thread_proc(void *arg)

{
  zipFile *ppvVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  void *__ptr;
  char *sheetname;
  
  pcVar4 = content_types_xml;
  ppvVar1 = *(zipFile **)((long)arg + 0x10);
  sVar3 = strlen(content_types_xml);
  zip_add_content_buffer(ppvVar1,"[Content_Types].xml",pcVar4,sVar3,0);
  pcVar4 = docprops_core_xml;
  ppvVar1 = *(zipFile **)((long)arg + 0x10);
  sVar3 = strlen(docprops_core_xml);
  zip_add_content_buffer(ppvVar1,"docProps/core.xml",pcVar4,sVar3,0);
  pcVar4 = docprops_app_xml;
  ppvVar1 = *(zipFile **)((long)arg + 0x10);
  sVar3 = strlen(docprops_app_xml);
  zip_add_content_buffer(ppvVar1,"docProps/app.xml",pcVar4,sVar3,0);
  pcVar4 = rels_xml;
  ppvVar1 = *(zipFile **)((long)arg + 0x10);
  sVar3 = strlen(rels_xml);
  zip_add_content_buffer(ppvVar1,"_rels/.rels",pcVar4,sVar3,0);
  pcVar4 = styles_xml;
  ppvVar1 = *(zipFile **)((long)arg + 0x10);
  sVar3 = strlen(styles_xml);
  zip_add_content_buffer(ppvVar1,"xl/styles.xml",pcVar4,sVar3,0);
  pcVar4 = workbook_rels_xml;
  ppvVar1 = *(zipFile **)((long)arg + 0x10);
  sVar3 = strlen(workbook_rels_xml);
  zip_add_content_buffer(ppvVar1,"xl/_rels/workbook.xml.rels",pcVar4,sVar3,0);
  sheetname = (char *)0x0;
  if ((*(char **)((long)arg + 8) != (char *)0x0) &&
     (pcVar4 = strdup(*(char **)((long)arg + 8)), sheetname = pcVar4, pcVar4 != (char *)0x0)) {
    sVar3 = strlen(pcVar4);
    if (0x1f < sVar3) {
      pcVar4[0x1f] = '\0';
    }
    fix_xml_special_chars(&sheetname);
  }
  pcVar4 = "Sheet1";
  if (sheetname != (char *)0x0) {
    pcVar4 = sheetname;
  }
  zip_add_dynamic_content_string
            (*(zipFile **)((long)arg + 0x10),"xl/workbook.xml",workbook_xml,pcVar4);
  free(sheetname);
  pcVar4 = sharedstrings_xml;
  ppvVar1 = *(zipFile **)((long)arg + 0x10);
  sVar3 = strlen(sharedstrings_xml);
  zip_add_content_buffer(ppvVar1,"xl/sharedStrings.xml",pcVar4,sVar3,0);
  iVar2 = zipOpenNewFileInZip(*(undefined8 *)((long)arg + 0x10),"xl/worksheets/sheet1.xml",0,0,0,0,0
                              ,0,8,9);
  if (iVar2 == 0) {
    __ptr = malloc(0x400);
    if (__ptr == (void *)0x0) {
      thread_proc_cold_3();
    }
    else {
      do {
        sVar3 = fread(__ptr,1,0x400,*(FILE **)((long)arg + 0x20));
        if (sVar3 == 0) goto LAB_00102c61;
        iVar2 = zipWriteInFileInZip(*(undefined8 *)((long)arg + 0x10),__ptr,sVar3 & 0xffffffff);
      } while (iVar2 == 0);
      thread_proc_cold_2();
LAB_00102c61:
      free(__ptr);
    }
    fclose(*(FILE **)((long)arg + 0x20));
    zipCloseFileInZip(*(undefined8 *)((long)arg + 0x10));
    zipClose(*(undefined8 *)((long)arg + 0x10),0);
  }
  else {
    thread_proc_cold_1();
  }
  *(undefined8 *)((long)arg + 0x10) = 0;
  *(undefined8 *)((long)arg + 0x20) = 0;
  return (void *)0x0;
}

Assistant:

void* thread_proc (void* arg)
#endif
{
  xlsxiowriter handle = (xlsxiowriter)arg;
  //generate required files
  zip_add_static_content_string(handle->zip, XML_FILENAME_CONTENTTYPES, content_types_xml);
  zip_add_static_content_string(handle->zip, XML_FOLDER_DOCPROPS XML_FILENAME_DOCPROPS_CORE, docprops_core_xml);
  zip_add_static_content_string(handle->zip, XML_FOLDER_DOCPROPS XML_FILENAME_DOCPROPS_APP, docprops_app_xml);
  zip_add_static_content_string(handle->zip, XML_FOLDER_RELS XML_FILENAME_RELS, rels_xml);
#ifndef WITHOUT_XLSX_STYLES
  zip_add_static_content_string(handle->zip, XML_FOLDER_XL XML_FILENAME_XL_STYLES, styles_xml);
#endif
#ifndef WITHOUT_XLSX_THEMES
  zip_add_static_content_string(handle->zip, XML_FOLDER_XL XML_FOLDER_THEMES XML_FILENAME_XL_THEME1, theme_xml);
#endif
  zip_add_static_content_string(handle->zip, XML_FOLDER_XL XML_FOLDER_RELS XML_FILENAME_XL_WORKBOOK_RELS, workbook_rels_xml);
  { //TO DO: this crashes on Linux
    char* sheetname = NULL;
    if (handle->sheetname) {
      sheetname = strdup(handle->sheetname);
      if (sheetname) {
        if (strlen(sheetname) > XML_SHEETNAME_MAXLEN)
          sheetname[XML_SHEETNAME_MAXLEN] = 0;
        fix_xml_special_chars(&sheetname);
      }
    }
    zip_add_dynamic_content_string(handle->zip, XML_FOLDER_XL XML_FILENAME_XL_WORKBOOK, workbook_xml, (sheetname ? sheetname : "Sheet1"));
    free(sheetname);
  }
#ifndef WITHOUT_XLSX_SHAREDSTRINGS
  zip_add_static_content_string(handle->zip, XML_FOLDER_XL XML_FILENAME_XL_SHAREDSTRINGS, sharedstrings_xml);
#endif

  //add sheet content file with pipe data
#ifdef USE_MINIZIP
#define MINIZIP_PIPE_BUFFER_SIZE 1024
//#error TO DO:
  if (zipOpenNewFileInZip(handle->zip, XML_FOLDER_XL XML_FOLDER_WORKSHEETS XML_FILENAME_XL_WORKSHEET1, NULL, NULL, 0, NULL, 0, NULL, Z_DEFLATED, 9) != ZIP_OK) {
    fprintf(stderr, "Error adding file");
  } else {
    char* buf;
    size_t buflen;
    if ((buf = (char*)malloc(MINIZIP_PIPE_BUFFER_SIZE)) == NULL) {
      fprintf(stderr, "Memory allocation error");/////
    } else {
      while ((buflen = fread(buf, 1, MINIZIP_PIPE_BUFFER_SIZE, handle->pipe_read)) > 0) {
        if (zipWriteInFileInZip(handle->zip, buf, buflen) != ZIP_OK) {
          fprintf(stderr, "Error writing file inside archive");/////
          break;
        }
      }
      free(buf);
    }
    fclose(handle->pipe_read);
    zipCloseFileInZip(handle->zip);
    zipClose(handle->zip, NULL);
  }
#else
  zip_source_t* zipsrc = zip_source_filep(handle->zip, handle->pipe_read, 0, -1);
  if (zip_file_add_custom(handle->zip, XML_FOLDER_XL XML_FOLDER_WORKSHEETS XML_FILENAME_XL_WORKSHEET1, zipsrc) < 0) {
    zip_source_free(zipsrc);
    fprintf(stderr, "Error adding file");
  }
#ifdef ZIP_RDONLY
  zip_file_set_mtime(handle->zip, zip_get_num_entries(handle->zip, 0) - 1, time(NULL), 0);
#endif
  //close zip file (processes all data, will block until pipe is closed)
  if (zip_close(handle->zip) != 0) {
    int ze, se;
#ifdef ZIP_RDONLY
    zip_error_t* error = zip_get_error(handle->zip);
    ze = zip_error_code_zip(error);
    se = zip_error_code_system(error);
#else
    zip_error_get(handle->zip, &ze, &se);
#endif
    fprintf(stderr, "zip_close failed (%i,%i)\n", ze, se);/////
    fprintf(stderr, "can't close zip archive : %s\n", zip_strerror(handle->zip));
  }
#endif
  handle->zip = NULL;
  handle->pipe_read = NULL;
#ifdef USE_WINTHREADS
  return 0;
#else
  return NULL;
#endif
}